

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv__open_cloexec(char *path,int flags)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  if (uv__open_cloexec_no_cloexec == '\0') {
    iVar1 = open64(path,flags | 0x80000);
    if (iVar1 != -1) {
      return iVar1;
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0x16) {
      return -*piVar3;
    }
    uv__open_cloexec_no_cloexec = '\x01';
  }
  iVar1 = open64(path,flags);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar1 = -*piVar3;
  }
  else {
    iVar2 = uv__cloexec_ioctl(iVar1,1);
    if (iVar2 != 0) {
      uv__close(iVar1);
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

int uv__open_cloexec(const char* path, int flags) {
  int err;
  int fd;

#if defined(UV__O_CLOEXEC)
  static int no_cloexec;

  if (!no_cloexec) {
    fd = open(path, flags | UV__O_CLOEXEC);
    if (fd != -1)
      return fd;

    if (errno != EINVAL)
      return -errno;

    /* O_CLOEXEC not supported. */
    no_cloexec = 1;
  }
#endif

  fd = open(path, flags);
  if (fd == -1)
    return -errno;

  err = uv__cloexec(fd, 1);
  if (err) {
    uv__close(fd);
    return err;
  }

  return fd;
}